

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int server_finish_handshake
              (ptls_t *tls,ptls_message_emitter_t *emitter,int send_cert_verify,
              st_ptls_signature_algorithms_t *signature_algorithms)

{
  size_t *psVar1;
  uint16_t uVar2;
  uint uVar3;
  ptls_key_schedule_t *ppVar4;
  st_ptls_encrypt_ticket_t *psVar5;
  char *src;
  ushort uVar6;
  int iVar7;
  st_ptls_hash_context_t *psVar8;
  ulong uVar9;
  uint64_t uVar10;
  size_t len;
  ptls_context_t *ppVar11;
  ushort uVar12;
  long lVar13;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *secret;
  ptls_buffer_t *ppVar14;
  uint8_t *puVar15;
  anon_struct_36_2_aa1086c1_for_ticket_context *__s;
  size_t sVar16;
  byte bVar17;
  size_t sVar18;
  int iVar19;
  ptls_iovec_t pVar20;
  undefined1 local_145;
  undefined1 local_144;
  undefined1 local_143;
  ushort local_142;
  ptls_context_t *local_140;
  undefined4 local_138;
  uint local_134;
  ptls_buffer_t session_id;
  size_t local_110;
  uint32_t ticket_age_add;
  size_t local_f8;
  ulong local_f0;
  size_t local_e8;
  char *local_e0;
  uint8_t *local_d8;
  size_t local_d0;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_c8;
  st_ptls_hash_context_t *local_c0;
  char session_id_smallbuf [128];
  
  if ((send_cert_verify == 0) ||
     (iVar7 = send_certificate_verify
                        (tls,emitter,signature_algorithms,"TLS 1.3, server CertificateVerify"),
     iVar7 == 0)) {
    iVar7 = send_finished(tls,emitter);
    if (iVar7 == 0) {
      if (tls->key_schedule->generation != 2) {
        __assert_fail("tls->key_schedule->generation == 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                      ,0x1336,
                      "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                     );
      }
      iVar7 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if ((((iVar7 == 0) &&
           (iVar7 = setup_traffic_protection(tls,1,"s ap traffic",3,0,0), iVar7 == 0)) &&
          (iVar7 = derive_secret(tls->key_schedule,&tls->field_19,"c ap traffic"), iVar7 == 0)) &&
         (iVar7 = derive_exporter_secret(tls,0), iVar7 == 0)) {
        ppVar11 = tls->ctx;
        if (tls->pending_handshake_secret == (uint8_t *)0x0) {
          if ((ppVar11->field_0xb8 & 8) == 0) {
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          }
          else {
            tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
          }
        }
        else if ((ppVar11->field_0xb8 & 0x10) == 0) {
          tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
        else {
          iVar7 = commission_handshake_secret(tls);
          if (iVar7 != 0) {
            return iVar7;
          }
          tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
          ppVar11 = tls->ctx;
        }
        if ((tls->field_19).server.num_tickets_to_send == '\0') {
LAB_0011871f:
          iVar7 = 0x202;
          if ((ppVar11->field_0xb8 & 8) == 0) {
            iVar7 = 0;
          }
        }
        else {
          if (ppVar11->ticket_lifetime == 0) {
            __assert_fail("tls->ctx->ticket_lifetime != 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                          ,0x1350,
                          "int server_finish_handshake(ptls_t *, ptls_message_emitter_t *, int, struct st_ptls_signature_algorithms_t *)"
                         );
          }
          local_c8 = &tls->traffic_protection;
          bVar17 = 0;
          do {
            if ((tls->field_19).server.num_tickets_to_send <= bVar17) {
              ppVar11 = tls->ctx;
              goto LAB_0011871f;
            }
            psVar8 = tls->key_schedule->hashes[0].ctx;
            psVar8 = (*psVar8->clone_)(psVar8);
            ppVar11 = tls->ctx;
            if (ppVar11->ticket_lifetime == 0) {
              __assert_fail("tls->ctx->ticket_lifetime != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                            ,0x755,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
            }
            if (ppVar11->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
              __assert_fail("tls->ctx->encrypt_ticket != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                            ,0x756,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
            }
            session_id.base = (uint8_t *)session_id_smallbuf;
            session_id.off = 0;
            session_id.capacity = 0x80;
            session_id.is_allocated = '\0';
            session_id.align_bits = '\0';
            ppVar14 = emitter->buf;
            sVar18 = ppVar14->off;
            local_c0 = psVar8;
            if ((tls->pending_handshake_secret == (uint8_t *)0x0) ||
               ((ppVar11->field_0xb8 & 0x10) != 0)) {
LAB_00117f8c:
              ppVar11 = (ptls_context_t *)tls->key_schedule;
              local_144 = 0x14;
              iVar7 = ptls_buffer__do_pushv(ppVar14,&local_144,1);
              if ((iVar7 == 0) &&
                 (local_140 = ppVar11, iVar7 = ptls_buffer__do_pushv(ppVar14,"",3), iVar7 == 0)) {
                sVar16 = ppVar14->off;
                iVar7 = ptls_buffer_reserve(emitter->buf,
                                            (tls->key_schedule->hashes[0].algo)->digest_size);
                if (iVar7 == 0) {
                  secret = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)
                           tls->pending_handshake_secret;
                  if ((anon_struct_208_2_4e55c0bb_for_traffic_protection *)
                      tls->pending_handshake_secret ==
                      (anon_struct_208_2_4e55c0bb_for_traffic_protection *)0x0) {
                    secret = local_c8;
                  }
                  iVar7 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,
                                           secret);
                  if (iVar7 == 0) {
                    psVar1 = &emitter->buf->off;
                    *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
                    uVar9 = ppVar14->off - sVar16;
                    iVar19 = 0x20c;
                    iVar7 = iVar19;
                    if (uVar9 < 0x1000000) {
                      for (lVar13 = 0x10; lVar13 != -8; lVar13 = lVar13 + -8) {
                        ppVar14->base[sVar16 - 3] = (uint8_t)(uVar9 >> ((byte)lVar13 & 0x3f));
                        sVar16 = sVar16 + 1;
                      }
                      if (local_140 != (ptls_context_t *)0x0) {
                        ptls__key_schedule_update_hash
                                  ((ptls_key_schedule_t *)local_140,ppVar14->base + sVar18,
                                   ppVar14->off - sVar18,0);
                      }
                      emitter->buf->off = sVar18;
                      (*tls->ctx->random_bytes)(&ticket_age_add,4);
                      if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                        local_140 = (ptls_context_t *)0x0;
                        puVar15 = (uint8_t *)session_id_smallbuf;
LAB_00118245:
                        iVar7 = (*emitter->begin_message)(emitter);
                        if (iVar7 == 0) {
                          ppVar14 = emitter->buf;
                          ppVar4 = tls->key_schedule;
                          local_f8 = ppVar14->off;
                          local_145 = 4;
                          iVar7 = ptls_buffer__do_pushv(ppVar14,&local_145,1);
                          if ((iVar7 == 0) &&
                             (iVar7 = ptls_buffer__do_pushv(ppVar14,"",3), iVar7 == 0)) {
                            local_110 = ppVar14->off;
                            uVar3 = tls->ctx->ticket_lifetime;
                            local_f0 = CONCAT44(local_f0._4_4_,
                                                uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 |
                                                (uVar3 & 0xff00) << 8 | uVar3 << 0x18);
                            iVar7 = ptls_buffer__do_pushv(emitter->buf,&local_f0,4);
                            if (iVar7 == 0) {
                              local_134 = ticket_age_add >> 0x18 | (ticket_age_add & 0xff0000) >> 8
                                          | (ticket_age_add & 0xff00) << 8 | ticket_age_add << 0x18;
                              iVar7 = ptls_buffer__do_pushv(emitter->buf,&local_134,4);
                              if ((iVar7 == 0) &&
                                 (iVar7 = ptls_buffer__do_pushv(emitter->buf,"",1), iVar7 == 0)) {
                                emitter->buf->base[emitter->buf->off - 1] = '\0';
                                iVar7 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                if (iVar7 == 0) {
                                  sVar18 = emitter->buf->off;
                                  psVar5 = tls->ctx->encrypt_ticket;
                                  pVar20.len = (size_t)local_140;
                                  pVar20.base = puVar15;
                                  iVar7 = (*psVar5->cb)(psVar5,tls,1,emitter->buf,pVar20);
                                  if ((iVar7 == 0) &&
                                     (uVar9 = emitter->buf->off - sVar18, iVar7 = iVar19,
                                     uVar9 < 0x10000)) {
                                    for (lVar13 = 8; lVar13 != -8; lVar13 = lVar13 + -8) {
                                      emitter->buf->base[sVar18 - 2] =
                                           (uint8_t)(uVar9 >> ((byte)lVar13 & 0x3f));
                                      sVar18 = sVar18 + 1;
                                    }
                                    iVar7 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                    if (iVar7 == 0) {
                                      sVar18 = emitter->buf->off;
                                      sVar16 = sVar18;
                                      if (tls->ctx->max_early_data_size == 0) {
LAB_00118672:
                                        uVar9 = sVar16 - sVar18;
                                        iVar7 = iVar19;
                                        if (uVar9 < 0x10000) {
                                          for (lVar13 = 8; lVar13 != -8; lVar13 = lVar13 + -8) {
                                            emitter->buf->base[sVar18 - 2] =
                                                 (uint8_t)(uVar9 >> ((byte)lVar13 & 0x3f));
                                            sVar18 = sVar18 + 1;
                                          }
                                          uVar9 = ppVar14->off - local_110;
                                          if (uVar9 < 0x1000000) {
                                            for (lVar13 = 0x10; lVar13 != -8; lVar13 = lVar13 + -8)
                                            {
                                              ppVar14->base[local_110 - 3] =
                                                   (uint8_t)(uVar9 >> ((byte)lVar13 & 0x3f));
                                              local_110 = local_110 + 1;
                                            }
                                            if (ppVar4 != (ptls_key_schedule_t *)0x0) {
                                              ptls__key_schedule_update_hash
                                                        (ppVar4,ppVar14->base + local_f8,
                                                         ppVar14->off - local_f8,0);
                                            }
                                            iVar7 = (*emitter->commit_message)(emitter);
                                          }
                                        }
                                      }
                                      else {
                                        local_142 = 0x2a00;
                                        iVar7 = ptls_buffer__do_pushv(emitter->buf,&local_142,2);
                                        if ((iVar7 == 0) &&
                                           (iVar7 = ptls_buffer__do_pushv(emitter->buf,"",2),
                                           iVar7 == 0)) {
                                          sVar16 = emitter->buf->off;
                                          uVar3 = tls->ctx->max_early_data_size;
                                          local_138 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 |
                                                      (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
                                          iVar7 = ptls_buffer__do_pushv(emitter->buf,&local_138,4);
                                          if ((iVar7 == 0) &&
                                             (uVar9 = emitter->buf->off - sVar16, iVar7 = iVar19,
                                             uVar9 < 0x10000)) {
                                            for (lVar13 = 8; lVar13 != -8; lVar13 = lVar13 + -8) {
                                              emitter->buf->base[sVar16 - 2] =
                                                   (uint8_t)(uVar9 >> ((byte)lVar13 & 0x3f));
                                              sVar16 = sVar16 + 1;
                                            }
                                            sVar16 = emitter->buf->off;
                                            goto LAB_00118672;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      else {
                        local_140 = tls->ctx;
                        ppVar4 = tls->key_schedule;
                        local_f8 = CONCAT44(local_f8._4_4_,ticket_age_add);
                        __s = (anon_struct_36_2_aa1086c1_for_ticket_context *)tls->server_name;
                        uVar2 = tls->key_share->id;
                        uVar6 = tls->cipher_suite->id;
                        local_e0 = tls->negotiated_protocol;
                        iVar7 = ptls_buffer__do_pushv(&session_id,"",2);
                        if (iVar7 == 0) {
                          local_e8 = session_id.off;
                          iVar7 = ptls_buffer__do_pushv(&session_id,"ptls0001",8);
                          if (iVar7 == 0) {
                            uVar10 = (*local_140->get_time->cb)(local_140->get_time);
                            local_f0 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
                                       (uVar10 & 0xff0000000000) >> 0x18 |
                                       (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 |
                                       (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28 |
                                       uVar10 << 0x38;
                            iVar7 = ptls_buffer__do_pushv(&session_id,&local_f0,8);
                            if (((iVar7 == 0) &&
                                (iVar7 = ptls_buffer__do_pushv(&session_id,"",2),
                                sVar18 = session_id.off, iVar7 == 0)) &&
                               (iVar7 = ptls_buffer_reserve(&session_id,
                                                            (ppVar4->hashes[0].algo)->digest_size),
                               iVar7 == 0)) {
                              local_d8 = session_id.base;
                              local_d0 = session_id.off;
                              iVar7 = derive_resumption_secret
                                                (ppVar4,session_id.base + session_id.off,
                                                 (ptls_iovec_t)ZEXT816(0));
                              if (iVar7 == 0) {
                                session_id.off = local_d0 + (ppVar4->hashes[0].algo)->digest_size;
                                uVar9 = session_id.off - sVar18;
                                if (uVar9 < 0x10000) {
                                  uVar12 = (ushort)uVar9;
                                  *(ushort *)(local_d8 + (sVar18 - 2)) = uVar12 << 8 | uVar12 >> 8;
                                  local_138._0_2_ = CONCAT11((char)uVar2,(char)(uVar2 >> 8));
                                  iVar7 = ptls_buffer__do_pushv(&session_id,&local_138,2);
                                  if (iVar7 == 0) {
                                    local_142 = uVar6 << 8 | uVar6 >> 8;
                                    iVar7 = ptls_buffer__do_pushv(&session_id,&local_142,2);
                                    if (iVar7 == 0) {
                                      local_134 = (uint)local_f8 >> 0x18 |
                                                  ((uint)local_f8 & 0xff0000) >> 8 |
                                                  ((uint)local_f8 & 0xff00) << 8 |
                                                  (uint)local_f8 << 0x18;
                                      iVar7 = ptls_buffer__do_pushv(&session_id,&local_134,4);
                                      if ((iVar7 == 0) &&
                                         (iVar7 = ptls_buffer__do_pushv(&session_id,"",2),
                                         sVar18 = session_id.off, iVar7 == 0)) {
                                        if (((local_140->ticket_context).field_0x20 & 1) == 0) {
                                          if (__s != (anon_struct_36_2_aa1086c1_for_ticket_context *
                                                     )0x0) {
                                            sVar16 = strlen((char *)__s);
                                            goto LAB_0011858c;
                                          }
                                        }
                                        else {
                                          __s = &local_140->ticket_context;
                                          sVar16 = 0x20;
LAB_0011858c:
                                          iVar7 = ptls_buffer__do_pushv(&session_id,__s,sVar16);
                                          if (iVar7 != 0) goto LAB_00118021;
                                        }
                                        uVar9 = session_id.off - sVar18;
                                        if (0xffff < uVar9) goto LAB_001183be;
                                        uVar6 = (ushort)uVar9;
                                        *(ushort *)(session_id.base + (sVar18 - 2)) =
                                             uVar6 << 8 | uVar6 >> 8;
                                        iVar7 = ptls_buffer__do_pushv(&session_id,"",1);
                                        src = local_e0;
                                        sVar18 = session_id.off;
                                        if (iVar7 == 0) {
                                          local_140 = (ptls_context_t *)session_id.off;
                                          if (local_e0 != (char *)0x0) {
                                            len = strlen(local_e0);
                                            iVar7 = ptls_buffer__do_pushv(&session_id,src,len);
                                            if (iVar7 != 0) goto LAB_00118021;
                                          }
                                          uVar9 = session_id.off - sVar18;
                                          local_140 = (ptls_context_t *)session_id.off;
                                          if (0xff < uVar9) goto LAB_001183be;
                                          session_id.base[sVar18 - 1] = (uint8_t)uVar9;
                                          iVar7 = 0x20c;
                                          if (session_id.off - local_e8 < 0x10000) {
                                            uVar6 = (ushort)(session_id.off - local_e8);
                                            *(ushort *)(session_id.base + (local_e8 - 2)) =
                                                 uVar6 << 8 | uVar6 >> 8;
                                            puVar15 = session_id.base;
                                            goto LAB_00118245;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                                else {
LAB_001183be:
                                  iVar7 = 0x20c;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            else {
              if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
                __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                              "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                              ,0x75d,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
              }
              ppVar4 = tls->key_schedule;
              local_143 = 5;
              iVar7 = ptls_buffer__do_pushv(ppVar14,&local_143,1);
              if ((iVar7 == 0) && (iVar7 = ptls_buffer__do_pushv(ppVar14,"",3), iVar7 == 0)) {
                sVar16 = ppVar14->off;
                for (lVar13 = -3; lVar13 != 0; lVar13 = lVar13 + 1) {
                  ppVar14->base[lVar13 + sVar16] = '\0';
                }
                if (ppVar4 != (ptls_key_schedule_t *)0x0) {
                  ptls__key_schedule_update_hash
                            (ppVar4,ppVar14->base + sVar18,ppVar14->off - sVar18,0);
                }
                ppVar14 = emitter->buf;
                ppVar14->off = sVar18;
                goto LAB_00117f8c;
              }
            }
LAB_00118021:
            ptls_buffer_dispose(&session_id);
            psVar8 = tls->key_schedule->hashes[0].ctx;
            (*psVar8->final)(psVar8,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
            tls->key_schedule->hashes[0].ctx = local_c0;
            bVar17 = bVar17 + 1;
          } while (iVar7 == 0);
        }
      }
    }
  }
  else if (iVar7 == 0x20b) {
    tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
    iVar7 = 0x20b;
  }
  return iVar7;
}

Assistant:

static int server_finish_handshake(ptls_t *tls, ptls_message_emitter_t *emitter, int send_cert_verify,
                                   struct st_ptls_signature_algorithms_t *signature_algorithms)
{
    int ret;

    if (send_cert_verify) {
        if ((ret = send_certificate_verify(tls, emitter, signature_algorithms, PTLS_SERVER_CERTIFICATE_VERIFY_CONTEXT_STRING)) !=
            0) {
            if (ret == PTLS_ERROR_ASYNC_OPERATION) {
                tls->state = PTLS_STATE_SERVER_GENERATING_CERTIFICATE_VERIFY;
            }
            goto Exit;
        }
    }

    if ((ret = send_finished(tls, emitter)) != 0)
        goto Exit;

    assert(tls->key_schedule->generation == 2);
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 1, "s ap traffic", 3, 0, 0)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, tls->server.pending_traffic_secret, "c ap traffic")) != 0)
        goto Exit;
    if ((ret = derive_exporter_secret(tls, 0)) != 0)
        goto Exit;

    if (tls->pending_handshake_secret != NULL) {
        if (tls->ctx->omit_end_of_early_data) {
            if ((ret = commission_handshake_secret(tls)) != 0)
                goto Exit;
            tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
        } else {
            tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        }
    } else if (tls->ctx->require_client_authentication) {
        tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    }

    /* send session ticket if necessary */
    if (tls->server.num_tickets_to_send != 0) {
        assert(tls->ctx->ticket_lifetime != 0);
        for (uint8_t i = 0; i < tls->server.num_tickets_to_send; ++i)
            if ((ret = send_session_ticket(tls, emitter)) != 0)
                goto Exit;
    }

    if (tls->ctx->require_client_authentication) {
        ret = PTLS_ERROR_IN_PROGRESS;
    } else {
        ret = 0;
    }

Exit:
    return ret;
}